

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPackage.cpp
# Opt level: O0

PackageSymbol * slang::ast::builtins::createStdPackage(Compilation *c)

{
  NetType *args_3;
  Scope *pSVar1;
  Symbol *pSVar2;
  VariableLifetime local_1c;
  PackageSymbol *local_18;
  PackageSymbol *pkg;
  Compilation *c_local;
  
  pkg = (PackageSymbol *)c;
  args_3 = Compilation::getWireNetType(c);
  local_1c = Static;
  local_18 = BumpAllocator::
             emplace<slang::ast::PackageSymbol,slang::ast::Compilation&,char_const(&)[4],slang::SourceLocation_const&,slang::ast::NetType_const&,slang::ast::VariableLifetime>
                       (&c->super_BumpAllocator,c,(char (*) [4])"std",
                        (SourceLocation *)&SourceLocation::NoLocation,args_3,&local_1c);
  pSVar1 = &local_18->super_Scope;
  pSVar2 = createProcessClass((Compilation *)pkg);
  Scope::addMember(pSVar1,pSVar2);
  pSVar1 = &local_18->super_Scope;
  pSVar2 = createSemaphoreClass((Compilation *)pkg);
  Scope::addMember(pSVar1,pSVar2);
  pSVar1 = &local_18->super_Scope;
  pSVar2 = createMailboxClass((Compilation *)pkg);
  Scope::addMember(pSVar1,pSVar2);
  pSVar1 = &local_18->super_Scope;
  pSVar2 = createRandomizeFunc((Compilation *)pkg);
  Scope::addMember(pSVar1,pSVar2);
  return local_18;
}

Assistant:

const PackageSymbol& createStdPackage(Compilation& c) {
    auto pkg = c.emplace<PackageSymbol>(c, "std", NL, c.getWireNetType(), VariableLifetime::Static);
    pkg->addMember(createProcessClass(c));
    pkg->addMember(createSemaphoreClass(c));
    pkg->addMember(createMailboxClass(c));
    pkg->addMember(createRandomizeFunc(c));

    return *pkg;
}